

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

void __thiscall Gecko::Graph::reweight(Graph *this,uint k)

{
  Functional *pFVar1;
  ulong uVar2;
  Float FVar3;
  float fVar4;
  
  std::vector<float,_std::allocator<float>_>::resize
            (&this->bond,
             (long)(this->weight).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->weight).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2,0.0);
  for (uVar2 = 1;
      uVar2 < (ulong)((long)(this->adj).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(this->adj).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2);
      uVar2 = (ulong)((Index)uVar2 + 1)) {
    pFVar1 = this->functional;
    fVar4 = (this->weight).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[uVar2];
    FVar3 = length(this,(Index)uVar2);
    fVar4 = (float)(**(code **)(*(long *)pFVar1 + 0x48))(fVar4,FVar3,pFVar1,k);
    (this->bond).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar2] = fVar4;
  }
  return;
}

Assistant:

void
Graph::reweight(uint k)
{
  bond.resize(weight.size());
  for (Arc::Index a = 1; a < adj.size(); a++)
    bond[a] = functional->bond(weight[a], length(a), k);
}